

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

monst * boomhit(int dx,int dy)

{
  char cVar1;
  char cVar2;
  char cVar3;
  boolean bVar4;
  schar sVar5;
  uint uVar6;
  monst *mtmp;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  bhitpos = (coord)u._0_2_;
  uVar9 = 0;
  do {
    if ((xdir[uVar9] == dx) && (""[uVar9] == dy)) goto LAB_00297a07;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 8);
  uVar9 = 8;
LAB_00297a07:
  tmp_at(-2,0x40003);
  uVar6 = 2;
  iVar10 = 0;
  uVar7 = 0;
  while( true ) {
    iVar8 = (int)uVar9;
    if (iVar8 == 8) {
      iVar8 = 0;
    }
    tmp_at(-5,(uVar6 == 2) + 0x40003);
    cVar1 = xdir[iVar8];
    cVar2 = ""[iVar8];
    cVar3 = bhitpos.x + cVar1;
    bhitpos.y = bhitpos.y + cVar2;
    bhitpos.x = cVar3;
    mtmp = level->monsters[cVar3][bhitpos.y];
    if ((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) {
      m_respond(mtmp);
      goto LAB_00297b70;
    }
    if ((level->locations[cVar3][bhitpos.y].typ < '\x11') ||
       (bVar4 = closed_door(level,(int)cVar3,(int)bhitpos.y), bVar4 != '\0')) {
      bhitpos.y = bhitpos.y - cVar2;
      bhitpos.x = bhitpos.x - cVar1;
      goto LAB_00297b6e;
    }
    if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) break;
    tmp_at((int)bhitpos.x,(int)bhitpos.y);
    (*windowprocs.win_delay)();
    if (level->locations[bhitpos.x][bhitpos.y].typ == '\x1f') goto LAB_00297b6e;
    uVar6 = uVar6 == 2 | 2;
    uVar9 = (ulong)(iVar8 + (uint)((int)(uVar7 / 5) * -5 != iVar10));
    uVar7 = (ulong)((int)uVar7 + 1);
    iVar10 = iVar10 + -1;
    if (iVar10 == -10) {
LAB_00297b6e:
      mtmp = (monst *)0x0;
LAB_00297b70:
      tmp_at(-6,0);
      return mtmp;
    }
  }
  if (u.uprops[0x25].extrinsic == 0 && u.uprops[0x25].intrinsic == 0) {
    uVar6 = mt_random();
    sVar5 = acurr(3);
    if ((int)(uVar6 % 0x14) < (int)sVar5) {
      tmp_at(-6,0);
      pline("You skillfully catch the boomerang.");
      return &youmonst;
    }
  }
  uVar6 = mt_random();
  thitu(10,uVar6 % 10 + 1,(obj *)0x0,(obj *)0x0,(monst *)0x0,"boomerang");
  goto LAB_00297b6e;
}

Assistant:

struct monst *boomhit(int dx, int dy)
{
	int i, ct;
	int boom = E_boomleft;	/* showsym[] index  */
	struct monst *mtmp;

	bhitpos.x = u.ux;
	bhitpos.y = u.uy;

	for (i = 0; i < 8; i++) if (xdir[i] == dx && ydir[i] == dy) break;
	tmp_at(DISP_FLASH, dbuf_effect(E_MISC, boom));
	for (ct = 0; ct < 10; ct++) {
		if (i == 8) i = 0;
		boom = (boom == E_boomleft) ? E_boomright : E_boomleft;
		tmp_at(DISP_CHANGE, dbuf_effect(E_MISC, boom));/* change glyph */
		dx = xdir[i];
		dy = ydir[i];
		bhitpos.x += dx;
		bhitpos.y += dy;
		if (MON_AT(level, bhitpos.x, bhitpos.y)) {
			mtmp = m_at(level, bhitpos.x,bhitpos.y);
			m_respond(mtmp);
			tmp_at(DISP_END, 0);
			return mtmp;
		}
		if (!ZAP_POS(level->locations[bhitpos.x][bhitpos.y].typ) ||
		   closed_door(level, bhitpos.x, bhitpos.y)) {
			bhitpos.x -= dx;
			bhitpos.y -= dy;
			break;
		}
		if (bhitpos.x == u.ux && bhitpos.y == u.uy) { /* ct == 9 */
			if (Fumbling || rn2(20) >= ACURR(A_DEX)) {
				/* We hit ourselves, but don't credit it like that;
				 * a boomerang with properties will eventually
				 * land in artifact_hit(), which can't handle
				 * self-hits. */
				thitu(10, rnd(10), NULL, NULL, NULL,
					"boomerang");
				break;
			} else {	/* we catch it */
				tmp_at(DISP_END, 0);
				pline("You skillfully catch the boomerang.");
				return &youmonst;
			}
		}
		tmp_at(bhitpos.x, bhitpos.y);
		win_delay_output();
		if (ct % 5 != 0) i++;
		if (IS_SINK(level->locations[bhitpos.x][bhitpos.y].typ))
			break;	/* boomerang falls on sink */
	}
	tmp_at(DISP_END, 0);	/* do not leave last symbol */
	return NULL;
}